

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QModelIndex>>
          (QtPrivate *this,QDebug debug,char *which,QList<QModelIndex> *c)

{
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *pQVar1;
  long lVar2;
  long lVar3;
  _func_int **pp_Var4;
  QDebug *pQVar5;
  QModelIndex *pQVar6;
  QModelIndex *idx;
  QDebug dbg;
  QModelIndex *pQVar7;
  long in_FS_OFFSET;
  Stream *local_60;
  undefined1 local_58 [8];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(((debug.stream)->ts)._vptr_QTextStream + 6) = 0;
  pQVar5 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar5,'(');
  pQVar7 = (c->d).ptr;
  lVar3 = (c->d).size;
  pQVar6 = pQVar7 + lVar3;
  if (lVar3 == 0) goto LAB_003f8f2a;
  local_50.ptr = (QAbstractItemModel *)((debug.stream)->ts)._vptr_QTextStream;
  idx = (QModelIndex *)&local_50;
  pQVar1 = &local_50.ptr[2].super_QObject.d_ptr;
  *(int *)&pQVar1->d = *(int *)&pQVar1->d + 1;
  dbg.stream = (Stream *)local_48;
  ::operator<<(dbg,idx);
  while( true ) {
    QDebug::~QDebug((QDebug *)dbg.stream);
    QDebug::~QDebug((QDebug *)idx);
    pQVar7 = pQVar7 + 1;
LAB_003f8f2a:
    if (pQVar7 == pQVar6) break;
    pQVar5 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60 = pQVar5->stream;
    idx = (QModelIndex *)&local_60;
    local_60->ref = local_60->ref + 1;
    dbg.stream = (Stream *)local_58;
    ::operator<<(dbg,idx);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  pp_Var4 = ((debug.stream)->ts)._vptr_QTextStream;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(_func_int ***)this = pp_Var4;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}